

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::MergePartialFromCodedStream
          (CategoricalDistributionLayerParams *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  CategoricalDistributionLayerParams *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      google::protobuf::io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto switchD_002a8db2_default;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) != 8) break;
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                        (input,&this->seed_);
      goto joined_r0x002a8e9e;
    case 2:
      if ((tag_00 & 0xff) == 0x10) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&this->numsamples_);
        goto joined_r0x002a8e9e;
      }
      break;
    case 3:
      if ((tag_00 & 0xff) == 0x18) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->islogits_);
        goto joined_r0x002a8e9e;
      }
      break;
    case 4:
      if ((tag_00 & 0xff) == 0x25) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&this->eps_);
        goto joined_r0x002a8e9e;
      }
      break;
    case 5:
      if ((tag_00 & 0xff) == 0x2d) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&this->temperature_);
        goto joined_r0x002a8e9e;
      }
    }
switchD_002a8db2_default:
    if ((tag_00 == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
       WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
joined_r0x002a8e9e:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool CategoricalDistributionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CategoricalDistributionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 numSamples = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &numsamples_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isLogits = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &islogits_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float eps = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &eps_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float temperature = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &temperature_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CategoricalDistributionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CategoricalDistributionLayerParams)
  return false;
#undef DO_
}